

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_unix.c
# Opt level: O0

_Bool authunix_refresh(AUTH *auth,void *dummy)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  undefined1 auStack_c0 [4];
  int stat;
  XDR xdrs;
  timespec now;
  authunix_parms aup;
  audata *au;
  void *dummy_local;
  AUTH *auth_local;
  
  if (auth == (AUTH *)0x0) {
    __assert_fail("auth != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/auth_unix.c"
                  ,0x10c,"_Bool authunix_refresh(AUTH *, void *)");
  }
  iVar2 = memcmp(&auth->ah_cred,auth + 1,0x198);
  if (iVar2 == 0) {
    auth_local._7_1_ = false;
  }
  else {
    *(long *)(auth[2].ah_cred.oa_body + 0x13c) = *(long *)(auth[2].ah_cred.oa_body + 0x13c) + 1;
    now.tv_nsec = 0;
    xdrmem_ncreate((XDR *)auStack_c0,auth[1].ah_key.c,*(u_int *)((long)&auth[1].ah_ops + 4),
                   XDR_DECODE);
    uVar3 = xdr_authunix_parms((XDR *)auStack_c0,(authunix_parms *)&now.tv_nsec);
    if ((uVar3 & 1) == 0) {
      bVar1 = 0;
    }
    else {
      clock_gettime(6,(timespec *)&xdrs.x_op);
      xdrs.x_handy = 0;
      (*_auStack_c0->x_setpostn)((rpc_xdr *)auStack_c0,0);
      uVar3 = xdr_authunix_parms((XDR *)auStack_c0,(authunix_parms *)&now.tv_nsec);
      bVar1 = (byte)uVar3 & 1;
      if ((uVar3 & 1) != 0) {
        memcpy(&auth->ah_cred,auth + 1,0x198);
        marshal_new_auth(auth);
      }
    }
    xdrs.x_handy = 2;
    xdr_authunix_parms((XDR *)auStack_c0,(authunix_parms *)&now.tv_nsec);
    if (_auStack_c0->x_destroy != (_func_void_rpc_xdr_ptr *)0x0) {
      (*_auStack_c0->x_destroy)((rpc_xdr *)auStack_c0);
    }
    auth_local._7_1_ = bVar1 != 0;
  }
  return auth_local._7_1_;
}

Assistant:

static bool
authunix_refresh(AUTH *auth, void *dummy)
{
	struct audata *au = AUTH_PRIVATE(auth);
	struct authunix_parms aup;
	struct timespec now;
	XDR xdrs;
	int stat;

	assert(auth != NULL);

	if (memcmp(&auth->ah_cred, &au->au_origcred, sizeof(struct opaque_auth))
	    == 0) {
		/* there is no hope.  Punt */
		return (false);
	}
	au->au_shfaults++;

	/* first deserialize the creds back into a struct authunix_parms */
	aup.aup_machname = NULL;
	aup.aup_gids = NULL;
	xdrmem_create(&xdrs, au->au_origcred.oa_body, au->au_origcred.oa_length,
		      XDR_DECODE);
	stat = xdr_authunix_parms(&xdrs, &aup);
	if (!stat)
		goto done;

	/* update the time and serialize in place */
	(void)clock_gettime(CLOCK_MONOTONIC_FAST, &now);
	aup.aup_time = now.tv_sec;
	xdrs.x_op = XDR_ENCODE;
	XDR_SETPOS(&xdrs, 0);
	stat = xdr_authunix_parms(&xdrs, &aup);
	if (!stat)
		goto done;
	auth->ah_cred = au->au_origcred;
	marshal_new_auth(auth);
 done:
	/* free the struct authunix_parms created by deserializing */
	xdrs.x_op = XDR_FREE;
	(void)xdr_authunix_parms(&xdrs, &aup);
	XDR_DESTROY(&xdrs);
	return (stat);
}